

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasyEllipsoid::ChBodyEasyEllipsoid
          (ChBodyEasyEllipsoid *this,ChVector<double> *radius,double density,
          shared_ptr<chrono::ChMaterialSurface> *material,ChCollisionSystemType collision_type)

{
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_58;
  ChVector<double> local_48;
  
  (this->super_ChBody).super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  ChBody::ChBody(&this->super_ChBody,&PTR_construction_vtable_24__011525e0,collision_type);
  (this->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj = (_func_int **)0x1152080;
  (this->super_ChBody).super_ChBodyFrame.super_ChFrameMoving<double>.super_ChFrame<double>.
  _vptr_ChFrame = (_func_int **)0x1152380;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChContactable._vptr_ChContactable =
       (_func_int **)0x1152418;
  (this->super_ChBody).super_ChContactable_1vars<6>.super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x458);
  (this->super_ChBody).super_ChLoadableUVW = (ChLoadableUVW)0x1152550;
  local_48.m_data[0] = radius->m_data[0];
  local_48.m_data[1] = radius->m_data[1];
  local_48.m_data[2] = radius->m_data[2];
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  SetupBody(this,&local_48,density,true,true,(shared_ptr<chrono::ChMaterialSurface> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return;
}

Assistant:

ChBodyEasyEllipsoid::ChBodyEasyEllipsoid(ChVector<> radius,
                                         double density,
                                         std::shared_ptr<ChMaterialSurface> material,
                                         collision::ChCollisionSystemType collision_type)
    : ChBody(collision_type) {
    SetupBody(radius, density, true, true, material);
}